

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O1

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false>::~ConcreteMachine
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false> *this)

{
  function<void_(Cycles)> *pfVar1;
  StringSerialiser *__ptr;
  pointer ppCVar2;
  long *plVar3;
  FIRFilter *__ptr_00;
  pointer psVar4;
  pointer pdVar5;
  pointer puVar6;
  Flywheel *pFVar7;
  _Manager_type p_Var8;
  long lVar9;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0059b1c0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0059b270;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0059b2b8;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0059b2f0;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0059b308;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0059b320;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0059b350;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_0059b390;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0059b3a8;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_0059b3c8;
  (this->super_Delegate)._vptr_Delegate =
       (_func_int **)&PTR_card_did_change_select_constraints_0059b3e0;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&this->audio_queue_);
  std::
  vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ::~vector(&(this->joysticks_).joysticks_);
  (this->keyboard_).super_Keyboard._vptr_Keyboard = (_func_int **)&PTR__Keyboard_0059b4d8;
  __ptr = (this->keyboard_).string_serialiser_._M_t.
          super___uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>
          ._M_t.
          super__Tuple_impl<0UL,_Utility::StringSerialiser_*,_std::default_delete<Utility::StringSerialiser>_>
          .super__Head_base<0UL,_Utility::StringSerialiser_*,_false>._M_head_impl;
  if (__ptr != (StringSerialiser *)0x0) {
    std::default_delete<Utility::StringSerialiser>::operator()
              ((default_delete<Utility::StringSerialiser> *)&(this->keyboard_).string_serialiser_,
               __ptr);
  }
  (this->keyboard_).string_serialiser_._M_t.
  super___uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>.
  _M_t.
  super__Tuple_impl<0UL,_Utility::StringSerialiser_*,_std::default_delete<Utility::StringSerialiser>_>
  .super__Head_base<0UL,_Utility::StringSerialiser_*,_false>._M_head_impl = (StringSerialiser *)0x0;
  Inputs::Keyboard::~Keyboard(&(this->keyboard_).super_Keyboard);
  ppCVar2 = (this->just_in_time_cards_).
            super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->just_in_time_cards_).
                                  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar2
                   );
  }
  ppCVar2 = (this->every_cycle_cards_).
            super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->every_cycle_cards_).
                                  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar2
                   );
  }
  lVar9 = 0;
  do {
    plVar3 = *(long **)((long)&(this->cards_)._M_elems[7]._M_t.
                               super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>
                               .super__Head_base<0UL,_Apple::II::Card_*,_false> + lVar9);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
    *(undefined8 *)
     ((long)&(this->cards_)._M_elems[7]._M_t.
             super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
             super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
             super__Head_base<0UL,_Apple::II::Card_*,_false> + lVar9) = 0;
    lVar9 = lVar9 + -8;
  } while (lVar9 != -0x40);
  (this->speaker_).super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.
  super_Speaker._vptr_Speaker = (_func_int **)&PTR__LowpassBase_0059ad90;
  __ptr_00 = (this->speaker_).super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>
             .filter_._M_t.
             super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
             .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl;
  if (__ptr_00 != (FIRFilter *)0x0) {
    std::default_delete<SignalProcessing::FIRFilter>::operator()
              ((default_delete<SignalProcessing::FIRFilter> *)
               &(this->speaker_).
                super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.filter_,
               __ptr_00);
  }
  (this->speaker_).super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.filter_.
  _M_t.
  super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
  .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl = (FIRFilter *)0x0;
  psVar4 = (this->speaker_).super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.
           output_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4,(long)(this->speaker_).
                                 super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>
                                 .output_buffer_.super__Vector_base<short,_std::allocator<short>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar4);
  }
  psVar4 = (this->speaker_).super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.
           input_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4,(long)(this->speaker_).
                                 super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>
                                 .input_buffer_.super__Vector_base<short,_std::allocator<short>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar4);
  }
  (this->speaker_).super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.
  super_Speaker._vptr_Speaker = (_func_int **)&PTR__Speaker_00593c18;
  psVar4 = (this->speaker_).super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.
           super_Speaker.mix_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4,(long)*(pointer *)
                                  ((long)&(this->speaker_).
                                          super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>
                                          .super_Speaker.mix_buffer_.
                                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)psVar4);
  }
  pdVar5 = (this->mixer_).volumes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar5 != (pointer)0x0) {
    operator_delete(pdVar5,(long)(this->mixer_).volumes_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar5);
  }
  psVar4 = (this->mixer_).source_holder_.conversion_source_.
           super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4,(long)(this->mixer_).source_holder_.conversion_source_.
                                 super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)psVar4);
  }
  psVar4 = (this->mixer_).source_holder_.next_source_.conversion_source_.
           super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4,(long)*(pointer *)
                                  ((long)&(this->mixer_).source_holder_.next_source_.
                                          conversion_source_.
                                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)psVar4);
  }
  Concurrency::AsyncTaskQueue<false,_true,_void>::~AsyncTaskQueue(&this->audio_queue_);
  puVar6 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)(this->rom_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar6);
  }
  pFVar7 = (this->video_).super_VideoBase.crt_.vertical_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar7 != (Flywheel *)0x0) {
    operator_delete(pFVar7,0x24);
  }
  (this->video_).super_VideoBase.crt_.vertical_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  pFVar7 = (this->video_).super_VideoBase.crt_.horizontal_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar7 != (Flywheel *)0x0) {
    operator_delete(pFVar7,0x24);
  }
  (this->video_).super_VideoBase.crt_.horizontal_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  puVar6 = (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.character_rom_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)*(pointer *)
                                  ((long)&(this->video_).super_VideoBase.super_VideoSwitches<Cycles>
                                          .character_rom_.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)puVar6);
  }
  p_Var8 = (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_.target_.
           super__Function_base._M_manager;
  if (p_Var8 != (_Manager_type)0x0) {
    pfVar1 = &(this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_.target_;
    (*p_Var8)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  std::
  vector<DeferredQueue<Cycles>::DeferredAction,_std::allocator<DeferredQueue<Cycles>::DeferredAction>_>
  ::~vector((vector<DeferredQueue<Cycles>::DeferredAction,_std::allocator<DeferredQueue<Cycles>::DeferredAction>_>
             *)&(this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_);
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_005a16c0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_005a16f0;
  Inputs::Keyboard::~Keyboard(&(this->super_MappedKeyboardMachine).keyboard_);
  return;
}

Assistant:

~ConcreteMachine() {
			audio_queue_.flush();
		}